

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_err<>(Parser *this,csubstr fmt)

{
  code *pcVar1;
  long in_RDI;
  size_t len;
  anon_class_8_1_72ac95b1 dumpfn;
  _SubstrWriter writer;
  char errmsg [1024];
  ulong local_4a0;
  undefined1 local_490 [40];
  ulong local_468;
  _SubstrWriter *local_450;
  _SubstrWriter *local_448;
  substr local_440;
  _SubstrWriter local_430;
  char local_418 [224];
  anon_class_8_1_72ac95b1 *in_stack_fffffffffffffcc8;
  Parser *in_stack_fffffffffffffcd0;
  csubstr in_stack_fffffffffffffcd8;
  anon_class_8_1_72ac95b1 in_stack_fffffffffffffce8;
  
  basic_substring<char>::basic_substring<1024ul>(&local_440,(char (*) [1024])local_418);
  detail::_SubstrWriter::_SubstrWriter(&local_430,local_440,0);
  local_450 = &local_430;
  local_448 = local_450;
  (anonymous_namespace)::
  _parse_dump<c4::yml::Parser::_err<>(c4::basic_substring<char_const>)const::_lambda(c4::basic_substring<char_const>)_1_>
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffcd8);
  detail::_SubstrWriter::append(&local_430,'\n');
  _fmt_msg<c4::yml::Parser::_err<>(c4::basic_substring<char_const>)const::_lambda(c4::basic_substring<char_const>)_1_&>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (local_430.pos < 0x400) {
    local_4a0 = local_430.pos;
  }
  else {
    local_4a0 = 0x400;
  }
  local_468 = local_4a0;
  pcVar1 = *(code **)(*(long *)(in_RDI + 0x30) + 0x58);
  memcpy(local_490,(void *)(*(long *)(in_RDI + 0x9f0) + 0x30),0x28);
  (*pcVar1)(local_418,local_4a0,*(undefined8 *)(*(long *)(in_RDI + 0x30) + 0x40));
  return;
}

Assistant:

void Parser::_err(csubstr fmt, Args const& C4_RESTRICT ...args) const
{
    char errmsg[RYML_ERRMSG_SIZE];
    detail::_SubstrWriter writer(errmsg);
    auto dumpfn = [&writer](csubstr s){ writer.append(s); };
    _parse_dump(dumpfn, fmt, args...);
    writer.append('\n');
    _fmt_msg(dumpfn);
    size_t len = writer.pos < RYML_ERRMSG_SIZE ? writer.pos : RYML_ERRMSG_SIZE;
    m_tree->m_callbacks.m_error(errmsg, len, m_state->pos, m_tree->m_callbacks.m_user_data);
}